

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

void Abc_FrameUpdateGia(Abc_Frame_t *pAbc,Gia_Man_t *pNew)

{
  int iVar1;
  int iVar2;
  Gia_Man_t *pNew_local;
  Abc_Frame_t *pAbc_local;
  
  if (pNew == (Gia_Man_t *)0x0) {
    Abc_Print(-1,"Abc_FrameUpdateGia(): Tranformation has failed.\n");
  }
  else {
    iVar1 = Gia_ManPoNum(pNew);
    if (iVar1 == 0) {
      Abc_Print(0,"The current GIA has no primary outputs. Some commands may not work correctly.\n")
      ;
    }
    if (pNew != pAbc->pGia) {
      if (((pNew->vNamesIn == (Vec_Ptr_t *)0x0) && (pAbc->pGia != (Gia_Man_t *)0x0)) &&
         (pAbc->pGia->vNamesIn != (Vec_Ptr_t *)0x0)) {
        iVar1 = Gia_ManCiNum(pNew);
        iVar2 = Vec_PtrSize(pAbc->pGia->vNamesIn);
        if (iVar1 == iVar2) {
          pNew->vNamesIn = pAbc->pGia->vNamesIn;
          pAbc->pGia->vNamesIn = (Vec_Ptr_t *)0x0;
        }
      }
      if (((pNew->vNamesOut == (Vec_Ptr_t *)0x0) && (pAbc->pGia != (Gia_Man_t *)0x0)) &&
         (pAbc->pGia->vNamesOut != (Vec_Ptr_t *)0x0)) {
        iVar1 = Gia_ManCoNum(pNew);
        iVar2 = Vec_PtrSize(pAbc->pGia->vNamesOut);
        if (iVar1 == iVar2) {
          pNew->vNamesOut = pAbc->pGia->vNamesOut;
          pAbc->pGia->vNamesOut = (Vec_Ptr_t *)0x0;
        }
      }
      if (pAbc->pGia2 != (Gia_Man_t *)0x0) {
        Gia_ManStop(pAbc->pGia2);
      }
      pAbc->pGia2 = pAbc->pGia;
      pAbc->pGia = pNew;
    }
  }
  return;
}

Assistant:

void Abc_FrameUpdateGia( Abc_Frame_t * pAbc, Gia_Man_t * pNew )
{
    if ( pNew == NULL )
    {
        Abc_Print( -1, "Abc_FrameUpdateGia(): Tranformation has failed.\n" );
        return;
    }
    if ( Gia_ManPoNum(pNew) == 0 )
        Abc_Print( 0, "The current GIA has no primary outputs. Some commands may not work correctly.\n" );
    if ( pNew == pAbc->pGia )
        return;
    // transfer names
    if (!pNew->vNamesIn && pAbc->pGia && pAbc->pGia->vNamesIn && Gia_ManCiNum(pNew) == Vec_PtrSize(pAbc->pGia->vNamesIn))
    {
        pNew->vNamesIn = pAbc->pGia->vNamesIn;
        pAbc->pGia->vNamesIn = NULL;
    }
    if (!pNew->vNamesOut && pAbc->pGia && pAbc->pGia->vNamesOut && Gia_ManCoNum(pNew) == Vec_PtrSize(pAbc->pGia->vNamesOut))
    {
        pNew->vNamesOut = pAbc->pGia->vNamesOut;
        pAbc->pGia->vNamesOut = NULL;
    }
    // update
    if ( pAbc->pGia2 )
        Gia_ManStop( pAbc->pGia2 );
    pAbc->pGia2 = pAbc->pGia;
    pAbc->pGia  = pNew;
}